

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_NurbsCurve::IsContinuous
          (ON_NurbsCurve *this,continuity desired_continuity,double t,int *hint,
          double point_tolerance,double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  bool bIsLinear1;
  bool bIsLinear0;
  double is_linear_min_length;
  double is_linear_tolerance;
  int knot_mult;
  double segtol;
  int ii;
  int ki;
  int tmp_hint;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  double d2_tolerance_local;
  double d1_tolerance_local;
  double point_tolerance_local;
  int *hint_local;
  double t_local;
  ON_NurbsCurve *pOStack_18;
  continuity desired_continuity_local;
  ON_NurbsCurve *this_local;
  
  ki._3_1_ = 1;
  _tmp_hint = curvature_tolerance;
  curvature_tolerance_local = cos_angle_tolerance;
  cos_angle_tolerance_local = d2_tolerance;
  d2_tolerance_local = d1_tolerance;
  d1_tolerance_local = point_tolerance;
  point_tolerance_local = (double)hint;
  hint_local = (int *)t;
  t_local._4_4_ = desired_continuity;
  pOStack_18 = this;
  if (this->m_order < 3) {
    t_local._4_4_ = ON::PolylineContinuity(desired_continuity);
  }
  if ((this->m_knot[this->m_order + -2] < (double)hint_local) &&
     ((double)hint_local < this->m_knot[this->m_cv_count + -1])) {
    t_local._4_4_ = ON::ParametricContinuity(t_local._4_4_);
    if ((this->m_order < this->m_cv_count) && (t_local._4_4_ != C0_continuous)) {
      if (point_tolerance_local == 0.0) {
        ii = 0;
        point_tolerance_local = (double)&ii;
      }
      segtol._4_4_ = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,
                                       (double)hint_local,1,*(int *)point_tolerance_local);
      iVar3 = segtol._4_4_ + this->m_order;
      iVar4 = iVar3 + -2;
      dVar5 = (ABS(this->m_knot[iVar4]) + ABS(this->m_knot[iVar3 + -1]) +
              ABS(this->m_knot[iVar3 + -1] - this->m_knot[iVar4])) * 1.490116119385e-08;
      if (this->m_knot[iVar4] + dVar5 < this->m_knot[iVar3 + -1] - dVar5) {
        if ((dVar5 < ABS((double)hint_local - this->m_knot[iVar4])) || (iVar4 <= this->m_order + -2)
           ) {
          if ((ABS((double)hint_local - this->m_knot[iVar3 + -1]) <= dVar5) &&
             (iVar3 < this->m_cv_count)) {
            hint_local = (int *)this->m_knot[iVar3 + -1];
            segtol._4_4_ = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,
                                             (double)hint_local,1,*(int *)point_tolerance_local);
          }
        }
        else {
          hint_local = (int *)this->m_knot[iVar4];
        }
      }
      if (segtol._4_4_ < 0) {
        segtol._4_4_ = 0;
      }
      *(int *)point_tolerance_local = segtol._4_4_;
      iVar3 = this->m_order + -2 + segtol._4_4_;
      if ((this->m_order + -2 < iVar3) && (iVar3 < this->m_cv_count + -1)) {
        if ((this->m_knot[iVar3] == (double)hint_local) &&
           (!NAN(this->m_knot[iVar3]) && !NAN((double)hint_local))) {
          if (t_local._4_4_ == Cinfinity_continuous) {
            return false;
          }
          iVar4 = ON_KnotMultiplicity(this->m_order,this->m_cv_count,this->m_knot,iVar3);
          switch(t_local._4_4_) {
          case C1_continuous:
            if (1 < this->m_order - iVar4) {
              return true;
            }
            break;
          case C2_continuous:
            if (2 < this->m_order - iVar4) {
              return true;
            }
            break;
          case G1_continuous:
            if (1 < this->m_order - iVar4) {
              return true;
            }
            break;
          case G2_continuous:
          case Gsmooth_continuous:
            if (2 < this->m_order - iVar4) {
              return true;
            }
            break;
          default:
          }
          ki._3_1_ = ON_Curve::IsContinuous
                               (&this->super_ON_Curve,t_local._4_4_,(double)hint_local,
                                (int *)point_tolerance_local,d1_tolerance_local,d2_tolerance_local,
                                cos_angle_tolerance_local,curvature_tolerance_local,_tmp_hint);
          if (((((bool)ki._3_1_) && (t_local._4_4_ == Gsmooth_continuous)) &&
              (iVar4 == this->m_order + -1)) &&
             ((this->m_order + -2 < iVar3 && (iVar3 < this->m_cv_count + -1)))) {
            bVar1 = SpanIsLinear(this,(iVar3 - this->m_order) + 2,1e-08,1e-08);
            bVar2 = SpanIsLinear(this,iVar3 + this->m_order * -2 + 3,1e-08,1e-08);
            if (bVar1 == bVar2) {
              if ((!bVar1) &&
                 (bVar1 = ON_NurbsArcToArcTransitionIsNotGsmooth
                                    (this,iVar3,curvature_tolerance_local,_tmp_hint), bVar1)) {
                ki._3_1_ = 0;
              }
            }
            else {
              ki._3_1_ = 0;
            }
          }
        }
      }
    }
    return (bool)(ki._3_1_ & 1);
  }
  bVar1 = ON_Curve::IsContinuous
                    (&this->super_ON_Curve,t_local._4_4_,(double)hint_local,
                     (int *)point_tolerance_local,d1_tolerance_local,d2_tolerance_local,
                     cos_angle_tolerance_local,curvature_tolerance_local,_tmp_hint);
  return bVar1;
}

Assistant:

bool ON_NurbsCurve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  bool rc = true;

  if ( m_order <= 2 )
    desired_continuity = ON::PolylineContinuity((int)desired_continuity);

  if ( t <= m_knot[m_order-2] || t >= m_knot[m_cv_count-1] )
  {
    // 20 March 2003 Dale Lear
    //     Consistently handles locus case and out of domain case.
    rc = ON_Curve::IsContinuous( 
               desired_continuity, t, hint, 
               point_tolerance, 
               d1_tolerance, d2_tolerance, 
               cos_angle_tolerance, 
               curvature_tolerance );
    return rc;
  }

  // "locus" and "parametric" are the same at this point.
  desired_continuity = ON::ParametricContinuity((int)desired_continuity);

  if ( m_order < m_cv_count && desired_continuity != ON::continuity::C0_continuous )
  {
    int tmp_hint;
    if ( !hint )
    {
      tmp_hint = 0;
      hint = &tmp_hint;
    }
    int ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t,1,*hint);

    {
      // 20 March 2003 Dale Lear:
      //     If t is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      int ii = ki+m_order-2;
      double segtol = (fabs(m_knot[ii]) + fabs(m_knot[ii+1]) + fabs(m_knot[ii+1]-m_knot[ii]))*ON_SQRT_EPSILON;
      if ( m_knot[ii]+segtol < m_knot[ii+1]-segtol )
      {
        if ( fabs(t-m_knot[ii]) <= segtol && ii > m_order-2 )
        {
          t = m_knot[ii];
        }
        else if ( fabs(t-m_knot[ii+1]) <= segtol && ii+2 < m_cv_count )
        {
          t = m_knot[ii+1];
          ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t,1,*hint);
        }
      }
    }

    if ( ki < 0 )
      ki = 0;
    *hint = ki;
    ki += m_order-2;
    if ( ki > m_order-2 && ki < m_cv_count-1 && m_knot[ki] == t  )
    {
      if ( ON::continuity::Cinfinity_continuous == desired_continuity )
      {
        // Cinfinity_continuous is a euphemism for "at a knot"
        return false;
      }

      // t = interior knot value - check for discontinuity
      int knot_mult = ON_KnotMultiplicity( m_order, m_cv_count, m_knot, ki );

      switch(desired_continuity)
      {
      case ON::continuity::C2_continuous: 
        if ( m_order - knot_mult >= 3 )
          return true;
        break;
      case ON::continuity::C1_continuous: 
        if ( m_order - knot_mult >= 2 )
          return true;
        break;
      case ON::continuity::G2_continuous: 
      case ON::continuity::Gsmooth_continuous: 
        if ( m_order - knot_mult >= 3 )
          return true;
        break;
      case ON::continuity::G1_continuous: 
        if ( m_order - knot_mult >= 2 )
          return true;
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
 
      // need to evaluate at knot
      rc = ON_Curve::IsContinuous( desired_continuity, t, hint, 
                           point_tolerance, d1_tolerance, d2_tolerance, 
                           cos_angle_tolerance, curvature_tolerance );

      if ( rc 
           && ON::continuity::Gsmooth_continuous == desired_continuity 
           && knot_mult == m_order-1 
           && ki > m_order-2
           && ki < m_cv_count-1
           )
      {
        // See if we are transitioning from linear to non-linear
        const double is_linear_tolerance = 1.0e-8;  
        const double is_linear_min_length = 1.0e-8;
        bool bIsLinear0 = SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance);
        bool bIsLinear1 = SpanIsLinear(ki - 2*m_order + 3,is_linear_min_length,is_linear_tolerance);
        if ( bIsLinear0 != bIsLinear1 )
        {
          rc = false;
        }
        else if ( !bIsLinear0 && ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
        {
          // aesthetic arc - arc discontinuity
          rc = false;
        }
      }
    }
  }
  return rc;
}